

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createPerQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 WrappedType<signed_char> min,WrappedType<signed_char> max)

{
  Byte BVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  int componentNdx;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  deRandom rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  if (stride == 0) {
    stride = componentCount;
  }
  iVar2 = stride * 6;
  uVar9 = 0;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar2 = 0;
  }
  pcVar3 = (char *)operator_new__((long)(iVar2 * count));
  uVar5 = (ulong)(uint)componentCount;
  if (componentCount < 1) {
    uVar5 = uVar9;
  }
  uVar7 = (ulong)(uint)count;
  if (count < 1) {
    uVar7 = uVar9;
  }
  for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
    lVar8 = (long)(int)uVar9;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      BVar1 = getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                        (&local_40,min.m_value,max.m_value);
      pcVar3[uVar6 + lVar8] = BVar1.m_value;
      pcVar3[uVar6 + lVar8 + stride] = BVar1.m_value;
      pcVar3[uVar6 + lVar8 + stride * 2] = BVar1.m_value;
      pcVar3[uVar6 + lVar8 + stride * 3] = BVar1.m_value;
      pcVar3[uVar6 + lVar8 + stride * 4] = BVar1.m_value;
      pcVar3[uVar6 + lVar8 + stride * 5] = BVar1.m_value;
    }
    uVar9 = (ulong)(uint)((int)uVar9 + iVar2);
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}